

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O1

void __thiscall
GmmLib::GmmTextureCalc::GetGenericRestrictions
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,__GMM_BUFFER_TYPE *pBuff)

{
  GMM_RESOURCE_TYPE GVar1;
  anon_struct_8_45_9b07292e_for_Gpu aVar2;
  anon_struct_8_44_94931171_for_Info aVar3;
  uint32_t uVar4;
  uint8_t uVar5;
  int iVar6;
  GMM_PLATFORM_INFO *pGVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar8;
  __GMM_BUFFER_TYPE *p_Var9;
  __GMM_BUFFER_TYPE *p_Var10;
  byte bVar11;
  
  bVar11 = 0;
  pGVar7 = GmmGetPlatformInfo(this->pGmmLibContext);
  aVar2 = (pTexInfo->Flags).Gpu;
  if ((aVar2._0_4_ >> 0x12 & 1) != 0) {
    (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->NoRestriction);
    return;
  }
  if (((ulong)aVar2 >> 0x22 & 1) != 0) {
    GVar1 = pTexInfo->Type;
    if (GVar1 == RESOURCE_3D) {
      p_Var9 = &pGVar7->Texture3DSurface;
    }
    else if (GVar1 == RESOURCE_CUBE) {
      p_Var9 = &pGVar7->CubeSurface;
    }
    else {
      if (GVar1 != RESOURCE_BUFFER) {
        p_Var9 = &pGVar7->Texture2DSurface;
        p_Var10 = pBuff;
        for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar4 = p_Var9->PitchAlignment;
          p_Var10->Alignment = p_Var9->Alignment;
          p_Var10->PitchAlignment = uVar4;
          p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
          p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
        }
        if (((pTexInfo->Flags).Info.field_0x2 & 8) != 0) {
          p_Var9 = &pGVar7->Texture2DLinearSurface;
          p_Var10 = pBuff;
          for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar4 = p_Var9->PitchAlignment;
            p_Var10->Alignment = p_Var9->Alignment;
            p_Var10->PitchAlignment = uVar4;
            p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
            p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
          }
        }
        uVar5 = GmmIsReconstructableSurface(pTexInfo->Format);
        if (uVar5 != '\0') {
          pBuff->MaxHeight = pGVar7->ReconMaxHeight;
          pBuff->MaxWidth = pGVar7->ReconMaxWidth;
        }
        goto LAB_001b021a;
      }
      p_Var9 = &pGVar7->BufferType;
    }
    p_Var10 = pBuff;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar4 = p_Var9->PitchAlignment;
      p_Var10->Alignment = p_Var9->Alignment;
      p_Var10->PitchAlignment = uVar4;
      p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
      p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
    }
  }
LAB_001b021a:
  if (((ulong)(pTexInfo->Flags).Gpu & 0x808002) != 0) {
    GVar1 = pTexInfo->Type;
    if (GVar1 == RESOURCE_3D) {
      p_Var9 = &pGVar7->Texture3DSurface;
    }
    else if (GVar1 == RESOURCE_CUBE) {
      p_Var9 = &pGVar7->CubeSurface;
    }
    else {
      if (GVar1 != RESOURCE_BUFFER) {
        p_Var9 = &pGVar7->Texture2DSurface;
        p_Var10 = pBuff;
        for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
          uVar4 = p_Var9->PitchAlignment;
          p_Var10->Alignment = p_Var9->Alignment;
          p_Var10->PitchAlignment = uVar4;
          p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
          p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
        }
        if (((pTexInfo->Flags).Info.field_0x2 & 8) != 0) {
          p_Var9 = &pGVar7->Texture2DLinearSurface;
          p_Var10 = pBuff;
          for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar4 = p_Var9->PitchAlignment;
            p_Var10->Alignment = p_Var9->Alignment;
            p_Var10->PitchAlignment = uVar4;
            p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
            p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
          }
        }
        uVar5 = GmmIsReconstructableSurface(pTexInfo->Format);
        if (uVar5 != '\0') {
          pBuff->MaxHeight = pGVar7->ReconMaxHeight;
          pBuff->MaxWidth = pGVar7->ReconMaxWidth;
        }
        goto LAB_001b025e;
      }
      p_Var9 = &pGVar7->BufferType;
    }
    p_Var10 = pBuff;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar4 = p_Var9->PitchAlignment;
      p_Var10->Alignment = p_Var9->Alignment;
      p_Var10->PitchAlignment = uVar4;
      p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
      p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
    }
  }
LAB_001b025e:
  if (((ulong)(pTexInfo->Flags).Gpu & 0x40) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Depth);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x4 & 0x40) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Vertex);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_00,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x1 & 8) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Index);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_01,iVar6);
  }
  if (((ulong)(pTexInfo->Flags).Gpu & 0x80) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->ASyncFlipSurface);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_02,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x2 & 2) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->MotionComp);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_03,iVar6);
  }
  if (((ulong)(pTexInfo->Flags).Gpu & 0x50002000) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Vertex);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_04,iVar6);
  }
  if ((*(ushort *)&(pTexInfo->Flags).Gpu.field_0x1 & 0x4002) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->NoRestriction);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_05,iVar6);
  }
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Constant);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_06,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x4 & 1) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Stream);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_07,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x1 & 0x40) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->InterlacedScan);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_08,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x4 & 2) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->TextApi);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_09,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x3 & 0x20) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Stencil);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_10,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x1 & 4) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->HiZ);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_11,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x4 & 0x80) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Video);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_12,iVar6);
    uVar5 = GmmIsReconstructableSurface(pTexInfo->Format);
    if (uVar5 != '\0') {
      pBuff->MaxHeight = pGVar7->ReconMaxHeight;
      pBuff->MaxWidth = pGVar7->ReconMaxWidth;
    }
  }
  if (((pTexInfo->Flags).Gpu.field_0x3 & 0x80) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->StateDx9ConstantBuffer);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_13,iVar6);
  }
  if (((pTexInfo->Flags).Gpu.field_0x2 & 8) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->Overlay);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_14,iVar6);
    if ((pTexInfo->Format == GMM_FORMAT_YCRCB_NORMAL) && (pTexInfo->BaseWidth == 0x280)) {
      pBuff->PitchAlignment = 0x40;
    }
  }
  if (((pTexInfo->Flags).Info.field_0x5 & 1) != 0) {
    iVar6 = (*this->_vptr_GmmTextureCalc[2])(this,pBuff,&pGVar7->XAdapter);
    pBuff = (__GMM_BUFFER_TYPE *)CONCAT44(extraout_var_15,iVar6);
    if (pTexInfo->Type == RESOURCE_BUFFER) {
      pBuff->MaxWidth = pGVar7->SurfaceMaxSize;
      pBuff->MaxPitch = (pGVar7->BufferType).MaxPitch;
      pBuff->MaxHeight = 1;
    }
  }
  aVar3 = (pTexInfo->Flags).Info;
  if ((((((ulong)aVar3 & 0x20) != 0) && ((pTexInfo->ExistingSysMem).IsGmmAllocated == '\0')) &&
      (((ulong)aVar3 & 0x200080000) != 0)) &&
     (((pTexInfo->ExistingSysMem).IsPageAligned == '\0' && (pTexInfo->Type == RESOURCE_BUFFER)))) {
    p_Var9 = &pGVar7->BufferType;
    p_Var10 = pBuff;
    for (lVar8 = 0xc; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar4 = p_Var9->PitchAlignment;
      p_Var10->Alignment = p_Var9->Alignment;
      p_Var10->PitchAlignment = uVar4;
      p_Var9 = (__GMM_BUFFER_TYPE *)((long)p_Var9 + (ulong)bVar11 * -0x10 + 8);
      p_Var10 = (__GMM_BUFFER_TYPE *)((long)p_Var10 + (ulong)bVar11 * -0x10 + 8);
    }
    pBuff->PitchAlignment = (pGVar7->NoRestriction).PitchAlignment;
    pBuff->LockPitchAlignment = (pGVar7->NoRestriction).LockPitchAlignment;
    pBuff->RenderPitchAlignment = (pGVar7->NoRestriction).LockPitchAlignment;
    pBuff->MinPitch = (pGVar7->NoRestriction).MinPitch;
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetGenericRestrictions(GMM_TEXTURE_INFO *pTexInfo, __GMM_BUFFER_TYPE *pBuff)
{
    GMM_DPF_ENTER;
    const GMM_PLATFORM_INFO *pPlatformResource = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    if(pTexInfo->Flags.Gpu.NoRestriction)
    {
        // Impose zero restrictions. Ignore any other GPU usage flags
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->NoRestriction);
        return;
    }

    if(pTexInfo->Flags.Gpu.Texture)
    {
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            *pBuff = pPlatformResource->BufferType;
        }
        else if(pTexInfo->Type == RESOURCE_CUBE)
        {
            *pBuff = pPlatformResource->CubeSurface;
        }
        else if(pTexInfo->Type == RESOURCE_3D)
        {
            *pBuff = pPlatformResource->Texture3DSurface;
        }
        else
        {
            *pBuff = pPlatformResource->Texture2DSurface;
            if(pTexInfo->Flags.Info.Linear)
            {
                *pBuff = pPlatformResource->Texture2DLinearSurface;
            }
            if(GmmIsReconstructableSurface(pTexInfo->Format))
            {
                pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
                pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
            }
        }
    }
    if(pTexInfo->Flags.Gpu.RenderTarget ||
       pTexInfo->Flags.Gpu.CCS ||
       pTexInfo->Flags.Gpu.MCS)
    {
        // Gen7 onwards, bound by SURFACE_STATE constraints.
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            *pBuff = pPlatformResource->BufferType;
        }
        else if(pTexInfo->Type == RESOURCE_CUBE)
        {
            *pBuff = pPlatformResource->CubeSurface;
        }
        else if(pTexInfo->Type == RESOURCE_3D)
        {
            *pBuff = pPlatformResource->Texture3DSurface;
        }
        else
        {
            *pBuff = pPlatformResource->Texture2DSurface;
            if(pTexInfo->Flags.Info.Linear)
            {
                *pBuff = pPlatformResource->Texture2DLinearSurface;
            }
            if(GmmIsReconstructableSurface(pTexInfo->Format))
            {
                pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
                pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
            }
        }
    }
    if(pTexInfo->Flags.Gpu.Depth)
    {
        // Z
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Depth);
    }
    if(pTexInfo->Flags.Gpu.Vertex)
    {
        // VertexData
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Vertex);
    }
    if(pTexInfo->Flags.Gpu.Index)
    {
        // Index buffer
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Index);
    }
    if(pTexInfo->Flags.Gpu.FlipChain)
    {
        // Async Flip
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->ASyncFlipSurface);
    }
    if(pTexInfo->Flags.Gpu.MotionComp)
    {
        // Media buffer
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->MotionComp);
    }
    if(pTexInfo->Flags.Gpu.State ||
       pTexInfo->Flags.Gpu.InstructionFlat ||
       pTexInfo->Flags.Gpu.ScratchFlat)
    {
        // indirect state
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Vertex);
    }
    if(pTexInfo->Flags.Gpu.Query ||
       pTexInfo->Flags.Gpu.HistoryBuffer)
    {
        // Query
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->NoRestriction);
    }
    if(pTexInfo->Flags.Gpu.Constant)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Constant);
    }
    if(pTexInfo->Flags.Gpu.Stream)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Stream);
    }
    if(pTexInfo->Flags.Gpu.InterlacedScan)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->InterlacedScan);
    }
    if(pTexInfo->Flags.Gpu.TextApi)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->TextApi);
    }
    if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Stencil);
    }
    if(pTexInfo->Flags.Gpu.HiZ)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->HiZ);
    }
    if(pTexInfo->Flags.Gpu.Video)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Video);
        if(GmmIsReconstructableSurface(pTexInfo->Format))
        {
            pBuff->MaxHeight = pPlatformResource->ReconMaxHeight;
            pBuff->MaxWidth  = pPlatformResource->ReconMaxWidth;
        }
    }
    if(pTexInfo->Flags.Gpu.StateDx9ConstantBuffer)
    {
        //
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->StateDx9ConstantBuffer);
    }
    if(pTexInfo->Flags.Gpu.Overlay)
    {
        // Overlay buffer use Async Flip values
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->Overlay);

        if((pTexInfo->Format == GMM_FORMAT_YUY2) && (pTexInfo->BaseWidth == 640))
        {
            // override the pitch alignment
            pBuff->PitchAlignment = 64;
        }
    }
    if(pTexInfo->Flags.Info.XAdapter)
    {
        //Add Cross Adapter resource restriction for hybrid graphics.
        pBuff = GetBestRestrictions(pBuff, &pPlatformResource->XAdapter);
        if(pTexInfo->Type == RESOURCE_BUFFER)
        {
            pBuff->MaxWidth  = pPlatformResource->SurfaceMaxSize;
            pBuff->MaxPitch  = pPlatformResource->BufferType.MaxPitch;
            pBuff->MaxHeight = 1;
        }
    }

    //Non Aligned ExistingSysMem  Special cases.
    if((pTexInfo->Flags.Info.ExistingSysMem &&
        (!pTexInfo->ExistingSysMem.IsGmmAllocated) &&
        (!pTexInfo->ExistingSysMem.IsPageAligned)))
    {

        if(pTexInfo->Flags.Info.Linear ||
           pTexInfo->Flags.Info.SVM)
        {
            if(pTexInfo->Type == RESOURCE_BUFFER)
            {
                //Use combination of BufferType, NoRestriction to support large buffer with minimal pitch alignment
                *pBuff                      = pPlatformResource->BufferType;
                pBuff->PitchAlignment       = pPlatformResource->NoRestriction.PitchAlignment;
                pBuff->LockPitchAlignment   = pPlatformResource->NoRestriction.LockPitchAlignment;
                pBuff->RenderPitchAlignment = pPlatformResource->NoRestriction.LockPitchAlignment;
                pBuff->MinPitch             = pPlatformResource->NoRestriction.MinPitch;
            }

            //[To DO] Handle other types when needed!
        }
        /*
        else if(Surf.Flags.Gpu.Texture)
        {
            //Override as and when required
        }
        else if(Surf.Flags.Gpu.RenderTarget)
        {
            //Overide as and when Required
        }*/
    }

    GMM_DPF_EXIT;
}